

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::df_store(Forth *this)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  double value1;
  double local_28;
  
  requireDStackDepth(this,1,"DF!");
  requireFStackDepth(this,1,"DF!");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  dVar3 = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  local_28 = dVar3;
  lVar2 = 0;
  do {
    dataSpaceSet(this,uVar1 + (int)lVar2,*(Char *)((long)&local_28 + lVar2));
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return;
}

Assistant:

void df_store() {
			REQUIRE_DSTACK_DEPTH(1, "DF!");
			REQUIRE_FSTACK_DEPTH(1, "DF!");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "DF!");
			auto x = fStack.getTop(); fStack.pop();
			setDataCell64(aaddr, x);
		}